

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterCoordinator.cpp
# Opt level: O2

void __thiscall helics::FilterCoordinator::closeFilter(FilterCoordinator *this,GlobalHandle filt)

{
  byte *pbVar1;
  FilterInfo *pFVar2;
  pointer ppFVar3;
  InterfaceHandle IVar4;
  pointer ppFVar5;
  GlobalFederateId GVar6;
  
  GVar6 = filt.fed_id.gid;
  pFVar2 = this->destFilter;
  IVar4 = filt.handle.hid;
  if (((pFVar2 != (FilterInfo *)0x0) && ((pFVar2->core_id).gid == GVar6.gid)) &&
     ((pFVar2->handle).hid == IVar4.hid)) {
    pbVar1 = (byte *)((long)&pFVar2->flags + 1);
    *pbVar1 = *pbVar1 | 0x10;
  }
  ppFVar3 = (this->allSourceFilters).
            super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppFVar5 = (this->allSourceFilters).
                 super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppFVar5 != ppFVar3; ppFVar5 = ppFVar5 + 1
      ) {
    pFVar2 = *ppFVar5;
    if (((pFVar2->core_id).gid == GVar6.gid) && ((pFVar2->handle).hid == IVar4.hid)) {
      pbVar1 = (byte *)((long)&pFVar2->flags + 1);
      *pbVar1 = *pbVar1 | 0x10;
    }
  }
  ppFVar3 = (this->cloningDestFilters).
            super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppFVar5 = (this->cloningDestFilters).
                 super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppFVar5 != ppFVar3; ppFVar5 = ppFVar5 + 1
      ) {
    pFVar2 = *ppFVar5;
    if (((pFVar2->core_id).gid == GVar6.gid) && ((pFVar2->handle).hid == IVar4.hid)) {
      pbVar1 = (byte *)((long)&pFVar2->flags + 1);
      *pbVar1 = *pbVar1 | 0x10;
    }
  }
  return;
}

Assistant:

void FilterCoordinator::closeFilter(GlobalHandle filt)
{
    if (destFilter != nullptr) {
        if ((destFilter->core_id == filt.fed_id) && (destFilter->handle == filt.handle)) {
            setActionFlag(*destFilter, disconnected_flag);
        }
    }
    for (auto sFilt : allSourceFilters) {
        if ((sFilt->core_id == filt.fed_id) && (sFilt->handle == filt.handle)) {
            setActionFlag(*sFilt, disconnected_flag);
        }
    }
    for (auto cFilt : cloningDestFilters) {
        if ((cFilt->core_id == filt.fed_id) && (cFilt->handle == filt.handle)) {
            setActionFlag(*cFilt, disconnected_flag);
        }
    }
}